

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O2

int SUNLinSolSolve_SPTFQMR(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype delta)

{
  int *piVar1;
  undefined8 uVar2;
  N_Vector p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  N_Vector p_Var6;
  undefined8 *puVar7;
  N_Vector p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  code *pcVar16;
  code *pcVar17;
  bool bVar18;
  int iVar19;
  int iVar20;
  void *pvVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  N_Vector p_Var25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  double dVar29;
  double dVar30;
  double __x;
  double dVar31;
  double local_158;
  double local_138;
  double local_108;
  double local_e8;
  double local_b8;
  undefined8 local_88;
  N_Vector Xv [3];
  sunrealtype cv [3];
  
  piVar1 = (int *)S->content;
  iVar20 = *piVar1;
  uVar2 = *(undefined8 *)(piVar1 + 0x16);
  p_Var3 = *(N_Vector *)(piVar1 + 0x18);
  uVar4 = *(undefined8 *)(piVar1 + 0x1a);
  uVar5 = *(undefined8 *)(piVar1 + 0x1c);
  p_Var6 = *(N_Vector *)(piVar1 + 0x1e);
  puVar7 = *(undefined8 **)(piVar1 + 0x20);
  p_Var8 = *(N_Vector *)(piVar1 + 0x22);
  uVar9 = *(undefined8 *)(piVar1 + 0x24);
  uVar10 = *(undefined8 *)(piVar1 + 0x26);
  uVar11 = *(undefined8 *)(piVar1 + 0x28);
  lVar12 = *(long *)(piVar1 + 0x12);
  lVar13 = *(long *)(piVar1 + 0x14);
  uVar14 = *(undefined8 *)(piVar1 + 10);
  uVar15 = *(undefined8 *)(piVar1 + 0x10);
  pcVar16 = *(code **)(piVar1 + 8);
  pcVar17 = *(code **)(piVar1 + 0xe);
  piVar1[3] = 0;
  uVar26 = piVar1[1];
  uVar23 = uVar26 & 0xfffffffe;
  if (uVar23 == 2) {
    if (piVar1[2] == 0) {
      piVar1[6] = -0x270e;
      return -0x270e;
    }
LAB_0011dbf2:
    N_VScale(0x3ff0000000000000,b);
LAB_0011dc32:
    uVar26 = uVar26 | 2;
    if (uVar26 == 3) {
      iVar19 = (*pcVar17)(delta,uVar15,uVar2,uVar9,1);
      if (iVar19 == 0) goto LAB_0011dc7e;
LAB_0011dc56:
      piVar1[2] = 0;
      iVar22 = -0x328;
      iVar20 = 0x325;
      goto LAB_0011de74;
    }
    N_VScale(0x3ff0000000000000,uVar2,uVar9);
LAB_0011dc7e:
    if (lVar12 == 0) {
      N_VScale(0x3ff0000000000000,uVar9,uVar2);
    }
    else {
      N_VProd(lVar12,uVar9,uVar2);
    }
    local_108 = (double)N_VDotProd(uVar2,uVar2);
    dVar29 = 0.0;
    if (0.0 < local_108) {
      if (local_108 < 0.0) {
        dVar29 = sqrt(local_108);
      }
      else {
        dVar29 = SQRT(local_108);
      }
    }
    *(double *)(piVar1 + 4) = dVar29;
    if (dVar29 <= delta) {
      piVar1[2] = 0;
      pvVar21 = S->content;
      goto LAB_0011dde0;
    }
    if (lVar13 == 0) {
      N_VScale(0x3ff0000000000000,uVar2,uVar9);
    }
    else {
      N_VDiv(uVar2,lVar13,uVar9);
    }
    if (uVar23 == 2) {
      N_VScale(0x3ff0000000000000,uVar9,uVar5);
      iVar19 = (*pcVar17)(delta,uVar15,uVar5,uVar9,2);
      if (iVar19 != 0) goto LAB_0011dc56;
    }
    iVar19 = (*pcVar16)(uVar14,uVar9,uVar5);
    if (iVar19 == 0) {
      if (uVar26 == 3) {
        iVar19 = (*pcVar17)(delta,uVar15,uVar5,uVar9,1);
        if (iVar19 != 0) goto LAB_0011dc56;
      }
      else {
        N_VScale(0x3ff0000000000000,uVar5,uVar9);
      }
      if (lVar12 == 0) {
        N_VScale(0x3ff0000000000000,uVar9,uVar5);
      }
      else {
        N_VProd(lVar12,uVar9,uVar5);
      }
      N_VScale(0x3ff0000000000000,uVar2,*puVar7);
      N_VScale(0x3ff0000000000000,uVar2,p_Var8);
      N_VScale(0x3ff0000000000000,uVar2,p_Var6);
      N_VConst(0,uVar4);
      if ((lVar13 != 0) && (piVar1[2] == 0)) {
        N_VProd(lVar13,x);
      }
      iVar27 = 0;
      iVar22 = 0;
      if (0 < iVar20) {
        iVar22 = iVar20;
      }
      dVar31 = -1.0;
      bVar18 = false;
      local_138 = -1.0;
      local_b8 = 0.0;
      local_88._0_4_ = 0;
      local_88._4_4_ = 0;
      local_e8 = dVar29;
LAB_0011dffd:
      if (iVar27 != iVar22) {
        piVar1[3] = piVar1[3] + 1;
        dVar30 = (double)N_VDotProd(uVar2,uVar5);
        N_VLinearSum(0x3ff0000000000000,p_Var8,uVar5,p_Var3);
        N_VLinearSum(0x3ff0000000000000,0,p_Var8,p_Var3,puVar7[1]);
        if (lVar13 != 0) {
          N_VDiv(puVar7[1],lVar13,puVar7[1]);
        }
        if (uVar23 == 2) {
          N_VScale(0x3ff0000000000000,puVar7[1],uVar9);
          iVar19 = (*pcVar17)(delta,uVar15,uVar9,puVar7[1],2);
          if (iVar19 != 0) goto LAB_0011dc56;
        }
        iVar19 = (*pcVar16)(uVar14,puVar7[1],uVar9);
        if (iVar19 == 0) {
          if (uVar26 == 3) {
            iVar19 = (*pcVar17)(delta,uVar15,uVar9,puVar7[1],1);
            if (iVar19 != 0) goto LAB_0011dc56;
          }
          else {
            N_VScale(0x3ff0000000000000,uVar9,puVar7[1]);
          }
          if (lVar12 == 0) {
            N_VScale(0x3ff0000000000000,puVar7[1],uVar9);
          }
          else {
            N_VProd(lVar12,puVar7[1],uVar9);
          }
          N_VLinearSum(0x3ff0000000000000,*puVar7,uVar9,puVar7[1]);
          iVar24 = 0;
LAB_0011e1b6:
          if (iVar24 == 0) {
            dVar31 = (double)N_VDotProd(puVar7[1],puVar7[1]);
            local_138 = 0.0;
            if (0.0 < dVar31) {
              if (dVar31 < 0.0) {
                local_138 = sqrt(dVar31);
              }
              else {
                local_138 = SQRT(dVar31);
              }
            }
            local_158 = (double)N_VDotProd(*puVar7,*puVar7);
            p_Var25 = p_Var8;
            if (local_158 <= 0.0) {
              local_158 = local_138 * 0.0;
              if (0.0 < local_158) goto LAB_0011e2b0;
            }
            else {
              if (local_158 < 0.0) {
                dVar31 = sqrt(local_158);
              }
              else {
                dVar31 = SQRT(local_158);
              }
              if (0.0 < dVar31 * local_138) {
                if (local_158 < 0.0) {
                  local_158 = sqrt(local_158);
                }
                else {
                  local_158 = SQRT(local_158);
                }
                local_158 = local_158 * local_138;
LAB_0011e2b0:
                if (local_158 < 0.0) {
                  local_158 = sqrt(local_158);
                }
                else {
                  local_158 = SQRT(local_158);
                }
                goto LAB_0011e2d8;
              }
            }
            local_158 = 0.0;
          }
          else {
            if (iVar24 == 2) goto LAB_0011e643;
            local_158 = local_138;
            p_Var25 = p_Var3;
          }
LAB_0011e2d8:
          N_VLinearSum(0x3ff0000000000000,
                       SUB84((local_b8 * local_b8 * local_88) / (local_108 / dVar30),0),p_Var25,
                       uVar4,uVar4);
          local_b8 = local_158 / local_e8;
          dVar31 = local_b8 * local_b8 + 1.0;
          uVar28 = -(ulong)(0.0 < dVar31);
          dVar31 = (double)(~uVar28 & 0x7ff0000000000000 | (ulong)(1.0 / SQRT(dVar31)) & uVar28);
          local_88 = dVar31 * dVar31 * (local_108 / dVar30);
          if ((iVar24 == 0 && iVar27 == 0) && (piVar1[2] != 0)) {
            N_VScale(local_88,uVar4,x);
          }
          else {
            N_VLinearSum(0x3ff0000000000000,x,uVar4,x);
          }
          local_e8 = local_e8 * local_b8 * dVar31;
          iVar24 = iVar24 + 1;
          dVar31 = SQRT((double)iVar24) * local_e8;
          *(double *)(piVar1 + 4) = dVar31;
          SUNLogger_QueueMsg(S->sunctx->logger,3,"SUNLinSolSolve_SPTFQMR","iterate-residual",
                             "nli = %li, resnorm = %.16g",0);
          if (dVar31 <= delta) goto LAB_0011e87c;
          if (delta < dVar31) {
            if (lVar13 == 0) {
              N_VScale(0x3ff0000000000000,x,uVar9);
            }
            else {
              N_VDiv(x,lVar13,uVar9);
            }
            if (uVar23 == 2) {
              iVar19 = (*pcVar17)(delta,uVar15,uVar9,uVar10,2);
              if (iVar19 != 0) {
                piVar1[2] = 0;
                pvVar21 = S->content;
                goto LAB_0011e906;
              }
              N_VScale(0x3ff0000000000000,uVar10,uVar9);
            }
            iVar19 = (*pcVar16)(uVar14,uVar9,uVar10);
            if (iVar19 != 0) goto LAB_0011de64;
            if (uVar26 == 3) {
              iVar19 = (*pcVar17)(delta,uVar15,uVar10,uVar9,1);
              if (iVar19 != 0) goto LAB_0011dc56;
            }
            else {
              N_VScale(0x3ff0000000000000,uVar10,uVar9);
            }
            if (lVar12 == 0) {
              N_VScale(0x3ff0000000000000,uVar9,uVar10);
            }
            else {
              N_VProd(lVar12,uVar9,uVar10);
            }
            if (!bVar18) {
              if (uVar26 == 3) {
                iVar19 = (*pcVar17)(delta,uVar15,b,uVar11,1);
                if (iVar19 != 0) goto LAB_0011dc56;
              }
              else {
                N_VScale(0x3ff0000000000000,b,uVar11);
              }
              if (lVar12 != 0) {
                N_VProd(lVar12,uVar11);
              }
            }
            N_VLinearSum(0x3ff0000000000000,uVar11,uVar10,uVar9);
            __x = (double)N_VDotProd(uVar9,uVar9);
            dVar31 = 0.0;
            if (0.0 < __x) {
              if (__x < 0.0) {
                dVar31 = sqrt(__x);
              }
              else {
                dVar31 = SQRT(__x);
              }
            }
            *(double *)(piVar1 + 4) = dVar31;
            bVar18 = true;
            if (dVar31 <= delta) goto LAB_0011e87c;
          }
          goto LAB_0011e1b6;
        }
        goto LAB_0011de64;
      }
LAB_0011e87c:
      if ((iVar20 <= iVar27) && (dVar29 <= dVar31)) {
        piVar1[2] = 0;
        *(undefined4 *)((long)S->content + 0x18) = 0x322;
        return 0x322;
      }
      if (lVar13 != 0) {
        N_VDiv(delta,x,lVar13,x);
      }
      if (uVar23 == 2) {
        iVar19 = (*pcVar17)(delta,uVar15,x,uVar9,2);
        if (iVar19 != 0) {
          piVar1[2] = 0;
          pvVar21 = S->content;
LAB_0011e906:
          *(undefined4 *)((long)pvVar21 + 0x18) = 0xfffffcd8;
          return -0x328;
        }
        N_VScale(0x3ff0000000000000,uVar9,x);
      }
      piVar1[2] = 0;
      pvVar21 = S->content;
      if (iVar20 <= iVar27) {
        *(undefined4 *)((long)pvVar21 + 0x18) = 0x321;
        return 0x321;
      }
LAB_0011dde0:
      *(undefined4 *)((long)pvVar21 + 0x18) = 0;
      return 0;
    }
  }
  else {
    if (piVar1[2] != 0) goto LAB_0011dbf2;
    iVar19 = (*pcVar16)(uVar14,x,uVar2);
    if (iVar19 == 0) {
      N_VLinearSum(0x3ff0000000000000,0,b,uVar2,uVar2);
      goto LAB_0011dc32;
    }
  }
LAB_0011de64:
  piVar1[2] = 0;
  iVar22 = -0x325;
  iVar20 = 0x323;
LAB_0011de74:
  if (iVar19 < 0) {
    iVar20 = iVar22;
  }
  *(int *)((long)S->content + 0x18) = iVar20;
  return iVar20;
LAB_0011e643:
  dVar30 = (double)N_VDotProd(uVar2,puVar7[1]);
  local_108 = dVar30 / local_108;
  N_VLinearSum(0x3ff0000000000000,puVar7[1],p_Var3,p_Var8);
  cv[0] = local_108 * local_108;
  cv[2] = 1.0;
  Xv[0] = p_Var6;
  Xv[1] = p_Var3;
  Xv[2] = p_Var8;
  cv[1] = local_108;
  N_VLinearCombination(3,cv,Xv,p_Var6);
  if (lVar13 == 0) {
    N_VScale(0x3ff0000000000000,p_Var6,uVar9);
  }
  else {
    N_VDiv(p_Var6,lVar13,uVar9);
  }
  if (uVar23 == 2) {
    N_VScale(0x3ff0000000000000,uVar9,uVar5);
    iVar19 = (*pcVar17)(delta,uVar15,uVar5,uVar9,2);
    if (iVar19 != 0) goto LAB_0011dc56;
  }
  iVar19 = (*pcVar16)(uVar14,uVar9,uVar5);
  if (iVar19 != 0) goto LAB_0011de64;
  if (uVar26 == 3) {
    iVar19 = (*pcVar17)(delta,uVar15,uVar5,uVar9,1);
    if (iVar19 != 0) goto LAB_0011dc56;
  }
  else {
    N_VScale(0x3ff0000000000000,uVar5,uVar9);
  }
  if (lVar12 == 0) {
    N_VScale(0x3ff0000000000000,uVar9,uVar5);
  }
  else {
    N_VProd(lVar12,uVar9,uVar5);
  }
  N_VScale(0x3ff0000000000000,puVar7[1],*puVar7);
  iVar27 = iVar27 + 1;
  local_108 = dVar30;
  goto LAB_0011dffd;
}

Assistant:

int SUNLinSolSolve_SPTFQMR(SUNLinearSolver S, SUNDIALS_MAYBE_UNUSED SUNMatrix A,
                           N_Vector x, N_Vector b, sunrealtype delta)
{
  SUNFunctionBegin(S->sunctx);

  /* local data and shortcut variables */
  sunrealtype alpha, tau, eta, beta, c, sigma, v_bar, omega;
  sunrealtype rho[2];
  sunrealtype r_init_norm, r_curr_norm;
  sunrealtype temp_val;
  sunbooleantype preOnLeft, preOnRight, scale_x, scale_b, converged, b_ok;
  sunbooleantype* zeroguess;
  int n, m, l_max;
  void *A_data, *P_data;
  SUNATimesFn atimes;
  SUNPSolveFn psolve;
  sunrealtype* res_norm;
  int* nli;
  N_Vector sx, sb, r_star, q, d, v, p, *r, u, vtemp1, vtemp2, vtemp3;
  sunrealtype cv[3];
  N_Vector Xv[3];
  int status = SUN_SUCCESS;

  /* Make local shorcuts to solver variables. */
  l_max     = SPTFQMR_CONTENT(S)->maxl;
  r_star    = SPTFQMR_CONTENT(S)->r_star;
  q         = SPTFQMR_CONTENT(S)->q;
  d         = SPTFQMR_CONTENT(S)->d;
  v         = SPTFQMR_CONTENT(S)->v;
  p         = SPTFQMR_CONTENT(S)->p;
  r         = SPTFQMR_CONTENT(S)->r;
  u         = SPTFQMR_CONTENT(S)->u;
  vtemp1    = SPTFQMR_CONTENT(S)->vtemp1;
  vtemp2    = SPTFQMR_CONTENT(S)->vtemp2;
  vtemp3    = SPTFQMR_CONTENT(S)->vtemp3;
  sb        = SPTFQMR_CONTENT(S)->s1;
  sx        = SPTFQMR_CONTENT(S)->s2;
  A_data    = SPTFQMR_CONTENT(S)->ATData;
  P_data    = SPTFQMR_CONTENT(S)->PData;
  atimes    = SPTFQMR_CONTENT(S)->ATimes;
  psolve    = SPTFQMR_CONTENT(S)->Psolve;
  zeroguess = &(SPTFQMR_CONTENT(S)->zeroguess);
  nli       = &(SPTFQMR_CONTENT(S)->numiters);
  res_norm  = &(SPTFQMR_CONTENT(S)->resnorm);

  /* Initialize counters and convergence flag */
  temp_val = r_curr_norm = -ONE;
  *nli                   = 0;
  converged              = SUNFALSE;
  b_ok                   = SUNFALSE;

  /* set sunbooleantype flags for internal solver options */
  preOnLeft  = ((SPTFQMR_CONTENT(S)->pretype == SUN_PREC_LEFT) ||
               (SPTFQMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  preOnRight = ((SPTFQMR_CONTENT(S)->pretype == SUN_PREC_RIGHT) ||
                (SPTFQMR_CONTENT(S)->pretype == SUN_PREC_BOTH));
  scale_x    = (sx != NULL);
  scale_b    = (sb != NULL);

  /* Check for unsupported use case */
  if (preOnRight && !(*zeroguess))
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_ERR_ARG_INCOMPATIBLE;
    return SUN_ERR_ARG_INCOMPATIBLE;
  }

  /* Check if Atimes function has been set */
  SUNAssert(atimes, SUN_ERR_ARG_CORRUPT);

  /* If preconditioning, check if psolve has been set */
  SUNAssert(!(preOnLeft || preOnRight) || psolve, SUN_ERR_ARG_CORRUPT);

  /* Set r_star to initial (unscaled) residual r_star = r_0 = b - A*x_0 */
  /* NOTE: if x == 0 then just set residual to b and continue */
  if (*zeroguess)
  {
    N_VScale(ONE, b, r_star);
    SUNCheckLastErr();
  }
  else
  {
    status = atimes(A_data, x, r_star);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }
    N_VLinearSum(ONE, b, -ONE, r_star, r_star);
    SUNCheckLastErr();
  }

  /* Apply left preconditioner and b-scaling to r_star (or really just r_0) */
  if (preOnLeft)
  {
    status = psolve(P_data, r_star, vtemp1, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, r_star, vtemp1);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, vtemp1, r_star);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp1, r_star);
    SUNCheckLastErr();
  }

  /* Initialize rho[0] */
  /* NOTE: initialized here to reduce number of computations - avoid need
           to compute r_star^T*r_star twice, and avoid needlessly squaring
           values */
  rho[0] = N_VDotProd(r_star, r_star);
  SUNCheckLastErr();

  /* Compute norm of initial residual (r_0) to see if we really need
     to do anything */
  *res_norm = r_init_norm = SUNRsqrt(rho[0]);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                     "SUNLinSolSolve_SPFTQMR", "initial-residual",
                     "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

  if (r_init_norm <= delta)
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUN_SUCCESS;
    return (LASTFLAG(S));
  }

  /* Set v = A*r_0 (preconditioned and scaled) */
  if (scale_x)
  {
    N_VDiv(r_star, sx, vtemp1);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, r_star, vtemp1);
    SUNCheckLastErr();
  }

  if (preOnRight)
  {
    N_VScale(ONE, vtemp1, v);
    SUNCheckLastErr();
    status = psolve(P_data, v, vtemp1, delta, SUN_PREC_RIGHT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }

  status = atimes(A_data, vtemp1, v);
  if (status != 0)
  {
    *zeroguess = SUNFALSE;
    LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC : SUNLS_ATIMES_FAIL_REC;
    return (LASTFLAG(S));
  }

  if (preOnLeft)
  {
    status = psolve(P_data, v, vtemp1, delta, SUN_PREC_LEFT);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                 : SUNLS_PSOLVE_FAIL_REC;
      return (LASTFLAG(S));
    }
  }
  else
  {
    N_VScale(ONE, v, vtemp1);
    SUNCheckLastErr();
  }

  if (scale_b)
  {
    N_VProd(sb, vtemp1, v);
    SUNCheckLastErr();
  }
  else
  {
    N_VScale(ONE, vtemp1, v);
    SUNCheckLastErr();
  }

  /* Initialize remaining variables */
  N_VScale(ONE, r_star, r[0]);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, u);
  SUNCheckLastErr();
  N_VScale(ONE, r_star, p);
  SUNCheckLastErr();
  N_VConst(ZERO, d);
  SUNCheckLastErr();

  /* Set x = sx x if non-zero guess */
  if (scale_x && !(*zeroguess))
  {
    N_VProd(sx, x, x);
    SUNCheckLastErr();
  }

  tau   = r_init_norm;
  v_bar = eta = ZERO;

  /* START outer loop */
  for (n = 0; n < l_max; ++n)
  {
    /* Increment linear iteration counter */
    (*nli)++;

    /* sigma = r_star^T*v */
    sigma = N_VDotProd(r_star, v);
    SUNCheckLastErr();

    /* alpha = rho[0]/sigma */
    alpha = rho[0] / sigma;

    /* q = u-alpha*v */
    N_VLinearSum(ONE, u, -alpha, v, q);
    SUNCheckLastErr();

    /* r[1] = r[0]-alpha*A*(u+q) */
    N_VLinearSum(ONE, u, ONE, q, r[1]);
    SUNCheckLastErr();
    if (scale_x)
    {
      N_VDiv(r[1], sx, r[1]);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      N_VScale(ONE, r[1], vtemp1);
      SUNCheckLastErr();
      status = psolve(P_data, vtemp1, r[1], delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    status = atimes(A_data, r[1], vtemp1);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    if (preOnLeft)
    {
      status = psolve(P_data, vtemp1, r[1], delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, vtemp1, r[1]);
      SUNCheckLastErr();
    }

    if (scale_b)
    {
      N_VProd(sb, r[1], vtemp1);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, r[1], vtemp1);
      SUNCheckLastErr();
    }
    N_VLinearSum(ONE, r[0], -alpha, vtemp1, r[1]);
    SUNCheckLastErr();

    /* START inner loop */
    for (m = 0; m < 2; ++m)
    {
      /* d = [*]+(v_bar^2*eta/alpha)*d */
      /* NOTES:
       *   (1) [*] = u if m == 0, and q if m == 1
       *   (2) using temp_val reduces the number of required computations
       *       if the inner loop is executed twice
       */
      if (m == 0)
      {
        temp_val = N_VDotProd(r[1], r[1]);
        SUNCheckLastErr();
        temp_val = SUNRsqrt(temp_val);
        omega    = N_VDotProd(r[0], r[0]);
        SUNCheckLastErr();
        omega = SUNRsqrt(SUNRsqrt(omega) * temp_val);
        N_VLinearSum(ONE, u, SUNSQR(v_bar) * eta / alpha, d, d);
        SUNCheckLastErr();
      }
      else
      {
        omega = temp_val;
        N_VLinearSum(ONE, q, SUNSQR(v_bar) * eta / alpha, d, d);
        SUNCheckLastErr();
      }

      /* v_bar = omega/tau */
      v_bar = omega / tau;

      /* c = (1+v_bar^2)^(-1/2) */
      c = ONE / SUNRsqrt(ONE + SUNSQR(v_bar));

      /* tau = tau*v_bar*c */
      tau = tau * v_bar * c;

      /* eta = c^2*alpha */
      eta = SUNSQR(c) * alpha;

      /* x = x+eta*d */
      if (n == 0 && m == 0 && *zeroguess)
      {
        N_VScale(eta, d, x);
        SUNCheckLastErr();
      }
      else
      {
        N_VLinearSum(ONE, x, eta, d, x);
        SUNCheckLastErr();
      }

      /* Check for convergence... */
      /* NOTE: just use approximation to norm of residual, if possible */
      *res_norm = r_curr_norm = tau * SUNRsqrt(m + 1);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFOs
      SUNLogger_QueueMsg(S->sunctx->logger, SUN_LOGLEVEL_INFO,
                         "SUNLinSolSolve_SPTFQMR", "iterate-residual",
                         "nli = %li, resnorm = %.16g", (long int)0, *res_norm);
#endif

      /* Exit inner loop if iteration has converged based upon approximation
         to norm of current residual */
      if (r_curr_norm <= delta)
      {
        converged = SUNTRUE;
        break;
      }

      /* Decide if actual norm of residual vector should be computed */
      /* NOTES:
       *   (1) if r_curr_norm > delta, then check if actual residual norm
       *       is OK (recall we first compute an approximation)
       *   (2) if r_curr_norm >= r_init_norm and m == 1 and n == l_max, then
       *       compute actual residual norm to see if the iteration can be
       *       saved
       *   (3) the scaled and preconditioned right-hand side of the given
       *       linear system (denoted by b) is only computed once, and the
       *       result is stored in vtemp3 so it can be reused - reduces the
       *       number of psovles if using left preconditioning
       */
      if ((r_curr_norm > delta) ||
          (r_curr_norm >= r_init_norm && m == 1 && n == l_max))
      {
        /* Compute norm of residual ||b-A*x||_2 (preconditioned and scaled) */
        if (scale_x)
        {
          N_VDiv(x, sx, vtemp1);
          SUNCheckLastErr();
        }
        else
        {
          N_VScale(ONE, x, vtemp1);
          SUNCheckLastErr();
        }

        if (preOnRight)
        {
          status = psolve(P_data, vtemp1, vtemp2, delta, SUN_PREC_RIGHT);
          if (status != 0)
          {
            *zeroguess  = SUNFALSE;
            LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                       : SUNLS_PSOLVE_FAIL_UNREC;
            return (LASTFLAG(S));
          }
          N_VScale(ONE, vtemp2, vtemp1);
          SUNCheckLastErr();
        }

        status = atimes(A_data, vtemp1, vtemp2);
        if (status != 0)
        {
          *zeroguess  = SUNFALSE;
          LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                     : SUNLS_ATIMES_FAIL_REC;
          return (LASTFLAG(S));
        }

        if (preOnLeft)
        {
          status = psolve(P_data, vtemp2, vtemp1, delta, SUN_PREC_LEFT);
          if (status != 0)
          {
            *zeroguess  = SUNFALSE;
            LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                       : SUNLS_PSOLVE_FAIL_REC;
            return (LASTFLAG(S));
          }
        }
        else
        {
          N_VScale(ONE, vtemp2, vtemp1);
          SUNCheckLastErr();
        }

        if (scale_b)
        {
          N_VProd(sb, vtemp1, vtemp2);
          SUNCheckLastErr();
        }
        else
        {
          N_VScale(ONE, vtemp1, vtemp2);
          SUNCheckLastErr();
        }

        /* Only precondition and scale b once (result saved for reuse) */
        if (!b_ok)
        {
          b_ok = SUNTRUE;
          if (preOnLeft)
          {
            status = psolve(P_data, b, vtemp3, delta, SUN_PREC_LEFT);
            if (status != 0)
            {
              *zeroguess  = SUNFALSE;
              LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                         : SUNLS_PSOLVE_FAIL_REC;
              return (LASTFLAG(S));
            }
          }
          else
          {
            N_VScale(ONE, b, vtemp3);
            SUNCheckLastErr();
          }

          if (scale_b)
          {
            N_VProd(sb, vtemp3, vtemp3);
            SUNCheckLastErr();
          }
        }
        N_VLinearSum(ONE, vtemp3, -ONE, vtemp2, vtemp1);
        SUNCheckLastErr();
        r_curr_norm = N_VDotProd(vtemp1, vtemp1);
        SUNCheckLastErr();
        *res_norm = r_curr_norm = SUNRsqrt(r_curr_norm);

        /* Exit inner loop if inequality condition is satisfied
           (meaning exit if we have converged) */
        if (r_curr_norm <= delta)
        {
          converged = SUNTRUE;
          break;
        }
      }

    } /* END inner loop */

    /* If converged, then exit outer loop as well */
    if (converged == SUNTRUE) { break; }

    /* rho[1] = r_star^T*r_[1] */
    rho[1] = N_VDotProd(r_star, r[1]);
    SUNCheckLastErr();

    /* beta = rho[1]/rho[0] */
    beta = rho[1] / rho[0];

    /* u = r[1]+beta*q */
    N_VLinearSum(ONE, r[1], beta, q, u);
    SUNCheckLastErr();

    /* p = u+beta*(q+beta*p) = beta*beta*p + beta*q + u */
    cv[0] = SUNSQR(beta);
    Xv[0] = p;

    cv[1] = beta;
    Xv[1] = q;

    cv[2] = ONE;
    Xv[2] = u;

    SUNCheckCall(N_VLinearCombination(3, cv, Xv, p));

    /* v = A*p */
    if (scale_x)
    {
      N_VDiv(p, sx, vtemp1);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, p, vtemp1);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      N_VScale(ONE, vtemp1, v);
      SUNCheckLastErr();
      status = psolve(P_data, v, vtemp1, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }

    status = atimes(A_data, vtemp1, v);
    if (status != 0)
    {
      *zeroguess  = SUNFALSE;
      LASTFLAG(S) = (status < 0) ? SUNLS_ATIMES_FAIL_UNREC
                                 : SUNLS_ATIMES_FAIL_REC;
      return (LASTFLAG(S));
    }

    if (preOnLeft)
    {
      status = psolve(P_data, v, vtemp1, delta, SUN_PREC_LEFT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_REC;
        return (LASTFLAG(S));
      }
    }
    else
    {
      N_VScale(ONE, v, vtemp1);
      SUNCheckLastErr();
    }

    if (scale_b)
    {
      N_VProd(sb, vtemp1, v);
      SUNCheckLastErr();
    }
    else
    {
      N_VScale(ONE, vtemp1, v);
      SUNCheckLastErr();
    }

    /* Shift variable values */
    /* NOTE: reduces storage requirements */
    N_VScale(ONE, r[1], r[0]);
    SUNCheckLastErr();
    rho[0] = rho[1];

  } /* END outer loop */

  /* Determine return value */
  /* If iteration converged or residual was reduced, then return current iterate
   * (x) */
  if ((converged == SUNTRUE) || (r_curr_norm < r_init_norm))
  {
    if (scale_x)
    {
      N_VDiv(x, sx, x);
      SUNCheckLastErr();
    }

    if (preOnRight)
    {
      status = psolve(P_data, x, vtemp1, delta, SUN_PREC_RIGHT);
      if (status != 0)
      {
        *zeroguess  = SUNFALSE;
        LASTFLAG(S) = (status < 0) ? SUNLS_PSOLVE_FAIL_UNREC
                                   : SUNLS_PSOLVE_FAIL_UNREC;
        return (LASTFLAG(S));
      }
      N_VScale(ONE, vtemp1, x);
      SUNCheckLastErr();
    }

    *zeroguess = SUNFALSE;
    if (converged == SUNTRUE) { LASTFLAG(S) = SUN_SUCCESS; }
    else { LASTFLAG(S) = SUNLS_RES_REDUCED; }
    return (LASTFLAG(S));
  }
  else
  {
    *zeroguess  = SUNFALSE;
    LASTFLAG(S) = SUNLS_CONV_FAIL;
    return (LASTFLAG(S));
  }
}